

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__stream_eof(uv_stream_t *stream,uv_buf_t *buf)

{
  int iVar1;
  uv_loop_t *in_RSI;
  long in_RDI;
  uv_stream_t *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  uv_handle_type in_stack_ffffffffffffffec;
  
  *(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) | 0x200;
  uv__io_stop(in_RSI,(uv__io_t *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
  iVar1 = uv__io_active((uv__io_t *)in_RSI,in_stack_ffffffffffffffec);
  if (((iVar1 == 0) && ((*(uint *)(in_RDI + 0x30) & 0x4000) != 0)) &&
     (*(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) & 0xffffbfff,
     (*(uint *)(in_RDI + 0x30) & 0x2000) != 0)) {
    *(int *)(*(long *)(in_RDI + 0x10) + 8) = *(int *)(*(long *)(in_RDI + 0x10) + 8) + -1;
  }
  uv__stream_read_cb(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(uv_buf_t *)in_RSI,
                     in_stack_ffffffffffffffec);
  return;
}

Assistant:

static void uv__stream_eof(uv_stream_t* stream, const uv_buf_t* buf) {
  stream->flags |= UV_STREAM_READ_EOF;
  uv__io_stop(stream->loop, &stream->io_watcher, UV__POLLIN);
  if (!uv__io_active(&stream->io_watcher, UV__POLLOUT))
    uv__handle_stop(stream);
  uv__stream_read_cb(stream, UV_EOF, buf, UV_UNKNOWN_HANDLE);
}